

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params params,unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  long lVar1;
  ZSTD_customMem customMem;
  ZSTD_CCtx_params params_00;
  ZSTD_CDict *pZVar2;
  size_t sVar3;
  ZSTD_CDict *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 in_stack_00000000 [88];
  ZSTD_CDict *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ZSTD_strategy ZVar4;
  undefined4 uStack_74;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  ZSTD_strategy in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  ZSTD_dictContentType_e dictContentType;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_fffffffffffffff8;
  
  dictContentType = (ZSTD_dictContentType_e)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  ZVar4 = (ZSTD_strategy)&stack0x00000008;
  uStack_74 = (undefined4)((ulong)&stack0x00000008 >> 0x20);
  if ((in_RSI == 0) || (in_RDX < 8)) {
    if (in_RCX != (ZSTD_CDict *)0x0) {
      ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)&stack0xffffffffffffff94,in_RCX);
      lVar1 = CONCAT44(uStack_74,ZVar4);
      *(undefined8 *)(lVar1 + 4) = in_stack_ffffffffffffff94;
      *(ulong *)(lVar1 + 0xc) = CONCAT44(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      *(ulong *)(lVar1 + 0x14) = CONCAT44(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      *(ZSTD_strategy *)(lVar1 + 0x1c) = in_stack_ffffffffffffffac;
    }
    ZSTD_freeCDict(in_stack_ffffffffffffff38);
    *(undefined8 *)(in_RDI + 0x368) = 0;
    *(ZSTD_CDict **)(in_RDI + 0x370) = in_RCX;
  }
  else {
    if (*(long *)(in_RDI + 0x1a8) != 0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_freeCDict(in_stack_ffffffffffffff38);
    lVar1 = CONCAT44(uStack_74,ZVar4);
    dictContentType = (ZSTD_dictContentType_e)((ulong)*(undefined8 *)(lVar1 + 4) >> 0x20);
    in_stack_ffffffffffffffb8 = *(size_t *)(lVar1 + 0xc);
    in_stack_ffffffffffffffc0 = *(void **)(lVar1 + 0x14);
    in_stack_ffffffffffffffc8 = *(undefined4 *)(lVar1 + 0x1c);
    cParams.hashLog = (int)in_stack_ffffffffffffff78;
    cParams.searchLog = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    cParams.windowLog = (int)in_stack_ffffffffffffff70;
    cParams.chainLog = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    cParams.searchLength = (int)in_stack_ffffffffffffff80;
    cParams.targetLength = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    cParams.strategy = ZVar4;
    customMem._4_8_ = in_stack_ffffffffffffff94;
    customMem.customAlloc._0_4_ = in_stack_ffffffffffffff90;
    customMem.customFree._4_4_ = in_stack_ffffffffffffff9c;
    customMem.opaque._0_4_ = in_stack_ffffffffffffffa0;
    customMem.opaque._4_4_ = in_stack_ffffffffffffffa4;
    pZVar2 = ZSTD_createCDict_advanced
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        (ZSTD_dictLoadMethod_e)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        (ZSTD_dictContentType_e)in_stack_ffffffffffffff48,cParams,customMem);
    *(ZSTD_CDict **)(in_RDI + 0x368) = pZVar2;
    *(undefined8 *)(in_RDI + 0x370) = *(undefined8 *)(in_RDI + 0x368);
    if (*(long *)(in_RDI + 0x368) == 0) {
      return 0xffffffffffffffc0;
    }
  }
  params_00.cParams.chainLog = (int)in_RSI;
  params_00.cParams.hashLog = (int)((ulong)in_RSI >> 0x20);
  params_00.format = (int)in_RDX;
  params_00.cParams.windowLog = (int)(in_RDX >> 0x20);
  params_00.cParams.searchLog = (int)in_RDI;
  params_00.cParams.searchLength = (int)((ulong)in_RDI >> 0x20);
  params_00.cParams.targetLength = (int)in_stack_fffffffffffffff8;
  params_00.cParams.strategy = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  params_00._32_88_ = in_stack_00000000;
  sVar3 = ZSTD_resetCStream_internal
                    ((ZSTD_CStream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,dictContentType,
                     (ZSTD_CDict *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     params_00,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return sVar3;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    ZSTD_CCtx_params params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (dict && dictSize >= 8) {
        DEBUGLOG(4, "loading dictionary of size %u", (U32)dictSize);
        if (zcs->staticSize) {   /* static CCtx : never uses malloc */
            /* incompatible with internal cdict creation */
            return ERROR(memory_allocation);
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                            ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                            params.cParams, zcs->customMem);
        zcs->cdict = zcs->cdictLocal;
        if (zcs->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        if (cdict) {
            params.cParams = ZSTD_getCParamsFromCDict(cdict);  /* cParams are enforced from cdict; it includes windowLog */
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = NULL;
        zcs->cdict = cdict;
    }

    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}